

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O1

int add_pending_io(SOCKET_IO_INSTANCE *socket_io_instance,uchar *buffer,size_t size,
                  ON_SEND_COMPLETE on_send_complete,void *callback_context)

{
  SINGLYLINKEDLIST_HANDLE list;
  undefined8 *item;
  void *__dest;
  LIST_ITEM_HANDLE pLVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  
  item = (undefined8 *)malloc(0x28);
  if (item == (undefined8 *)0x0) {
    iVar3 = 0xe3;
  }
  else {
    __dest = malloc(size);
    *item = __dest;
    if (__dest == (void *)0x0) {
      p_Var2 = xlogging_get_log_function();
      iVar3 = 0xec;
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/socketio_berkeley.c"
                  ,"add_pending_io",0xea,1,"Allocation Failure: Unable to allocate pending list.");
      }
    }
    else {
      item[1] = size;
      item[2] = on_send_complete;
      item[3] = callback_context;
      list = socket_io_instance->pending_io_list;
      item[4] = list;
      memcpy(__dest,buffer,size);
      pLVar1 = singlylinkedlist_add(list,item);
      if (pLVar1 != (LIST_ITEM_HANDLE)0x0) {
        return 0;
      }
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/socketio_berkeley.c"
                  ,"add_pending_io",0xf8,1,"Failure: Unable to add socket to pending list.");
      }
      free((void *)*item);
      iVar3 = 0xfb;
    }
    free(item);
  }
  return iVar3;
}

Assistant:

static int add_pending_io(SOCKET_IO_INSTANCE* socket_io_instance, const unsigned char* buffer, size_t size, ON_SEND_COMPLETE on_send_complete, void* callback_context)
{
    int result;
    PENDING_SOCKET_IO* pending_socket_io = (PENDING_SOCKET_IO*)malloc(sizeof(PENDING_SOCKET_IO));
    if (pending_socket_io == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        pending_socket_io->bytes = (unsigned char*)malloc(size);
        if (pending_socket_io->bytes == NULL)
        {
            LogError("Allocation Failure: Unable to allocate pending list.");
            free(pending_socket_io);
            result = MU_FAILURE;
        }
        else
        {
            pending_socket_io->size = size;
            pending_socket_io->on_send_complete = on_send_complete;
            pending_socket_io->callback_context = callback_context;
            pending_socket_io->pending_io_list = socket_io_instance->pending_io_list;
            (void)memcpy(pending_socket_io->bytes, buffer, size);

            if (singlylinkedlist_add(socket_io_instance->pending_io_list, pending_socket_io) == NULL)
            {
                LogError("Failure: Unable to add socket to pending list.");
                free(pending_socket_io->bytes);
                free(pending_socket_io);
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }
        }
    }
    return result;
}